

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::
parse(parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *input,
     context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
     *ctx,component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *root_component,
     basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *error_message)

{
  allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
  *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  value_type pcVar1;
  initializer_list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __l;
  initializer_list<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
  __l_00;
  bool bVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pointer pcVar8;
  wstring *pwVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  wostream *pwVar13;
  ulong uVar14;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_02;
  reference ppcVar15;
  size_type sVar16;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__p;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_9f8;
  bool local_9c9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_960;
  anon_class_8_1_7d704ef0 local_8d8;
  walk_callback local_8d0;
  wstring local_8b0 [32];
  wostringstream local_890 [8];
  streamstring ss_2;
  reference local_718;
  wstring local_710 [32];
  wostringstream local_6f0 [8];
  streamstring ss_1;
  undefined1 local_578 [8];
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  comp;
  undefined1 local_4d0 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> tag_contents;
  wstring local_4a8 [32];
  wostringstream local_488 [8];
  streamstring ss;
  string_size_type tag_location_end;
  size_type current_tag_delimiter_end_size;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *current_tag_delimiter_end;
  _Alloc_hider *p_Stack_2f0;
  bool tag_is_unescaped_var;
  string_size_type tag_contents_location;
  string_size_type tag_location_start;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  comp_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *whitespace_text;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *__range5;
  bool parsed_whitespace;
  pointer pcStack_230;
  bool parse_tag;
  string_size_type input_position;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_220;
  allocator<wchar_t> local_1f9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_1d8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1d0;
  wstring local_1b0 [32];
  wstring local_190 [32];
  wstring local_170 [32];
  wstring local_150 [32];
  iterator local_130;
  size_type local_128;
  undefined1 local_120 [8];
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  whitespace;
  anon_class_24_3_f3e5c141 process_current_text;
  string_size_type current_text_position;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> current_text;
  vector<unsigned_long,_std::allocator<unsigned_long>_> section_starts;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_a8;
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  sections;
  bool current_delimiter_is_brace;
  string_size_type input_size;
  allocator<wchar_t> local_51;
  undefined1 local_50 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  brace_delimiter_end_unescaped;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *error_message_local;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *root_component_local;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *ctx_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *input_local;
  parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  brace_delimiter_end_unescaped.field_2._8_8_ = error_message;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_50,3,L'}',&local_51);
  std::allocator<wchar_t>::~allocator(&local_51);
  pcVar8 = (pointer)std::__cxx11::wstring::size();
  sections.
  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
       ::is_default(&ctx->delim_set);
  local_a0 = &local_a8;
  local_98 = 1;
  this_00 = (allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
             *)((long)&section_starts.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
  local_a8 = root_component;
  Catch::clara::std::
  allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
  ::allocator(this_00);
  __l_00._M_len = local_98;
  __l_00._M_array = local_a0;
  Catch::clara::std::
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  ::vector((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
            *)local_90,__l_00,this_00);
  Catch::clara::std::
  allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
  ::~allocator((allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
                *)((long)&section_starts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7));
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&current_text.field_2 + 8));
  std::__cxx11::wstring::wstring((wstring *)&current_text_position);
  process_current_text.sections =
       (vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
        *)0xffffffffffffffff;
  std::__cxx11::wstring::reserve((ulong)&current_text_position);
  whitespace.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&current_text_position;
  process_current_text.current_text =
       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
       &process_current_text.sections;
  process_current_text.current_text_position = (string_size_type *)local_90;
  input_position._2_1_ = 1;
  local_1d8 = &local_1d0;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_1f8,1,L'\r',&local_1f9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_220,1,L'\n',(allocator<wchar_t> *)((long)&input_position + 7));
  std::operator+(&local_1d0,&local_1f8,&local_220);
  local_1d8 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              local_1b0;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_1b0,1,L'\n',(allocator<wchar_t> *)((long)&input_position + 6));
  local_1d8 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              local_190;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_190,1,L'\r',(allocator<wchar_t> *)((long)&input_position + 5));
  local_1d8 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              local_170;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_170,1,L' ',(allocator<wchar_t> *)((long)&input_position + 4));
  local_1d8 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              local_150;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_150,1,L'\t',(allocator<wchar_t> *)((long)&input_position + 3));
  input_position._2_1_ = 0;
  local_130 = &local_1d0;
  local_128 = 5;
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)((long)&input_position + 1));
  __l._M_len = local_128;
  __l._M_array = local_130;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)local_120,__l,
           (allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            *)((long)&input_position + 1));
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *)((long)&input_position + 1));
  local_960 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              &local_130;
  do {
    local_960 = local_960 + -1;
    std::__cxx11::wstring::~wstring((wstring *)local_960);
  } while (local_960 != &local_1d0);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&input_position + 3));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&input_position + 4));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&input_position + 5));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&input_position + 6));
  std::__cxx11::wstring::~wstring((wstring *)&local_220);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&input_position + 7));
  std::__cxx11::wstring::~wstring((wstring *)&local_1f8);
  std::allocator<wchar_t>::~allocator(&local_1f9);
  pcStack_230 = (pointer)0x0;
  do {
    do {
      pcVar3 = pcStack_230;
      if (pcStack_230 == pcVar8) {
        parse::anon_class_24_3_f3e5c141::operator()
                  ((anon_class_24_3_f3e5c141 *)
                   &whitespace.
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_8d8.error_message =
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             brace_delimiter_end_unescaped.field_2._8_8_;
        std::
        function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
        ::
        function<kainjow::mustache::parser<std::__cxx11::wstring>::parse(std::__cxx11::wstring_const&,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::component<std::__cxx11::wstring>&,std::__cxx11::wstring&)const::_lambda(kainjow::mustache::component<std::__cxx11::wstring>&)_1_,void>
                  ((function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
                    *)&local_8d0,&local_8d8);
        component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::walk_children(root_component,&local_8d0);
        Catch::clara::std::
        function<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
        ::~function(&local_8d0);
        uVar14 = std::__cxx11::wstring::empty();
        if ((uVar14 & 1) == 0) {
          tag_contents.field_2._M_local_buf[3] = L'\x01';
        }
        else {
          tag_contents.field_2._M_local_buf[3] = L'\0';
        }
        goto LAB_0036d2f0;
      }
      bVar6 = false;
      pwVar9 = (wstring *)std::__cxx11::wstring::size();
      iVar7 = std::__cxx11::wstring::compare((ulong)input,(ulong)pcVar3,pwVar9);
      if (iVar7 == 0) {
        parse::anon_class_24_3_f3e5c141::operator()
                  ((anon_class_24_3_f3e5c141 *)
                   &whitespace.
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar6 = true;
      }
      else {
        bVar2 = false;
        __end0 = Catch::clara::std::
                 vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          *)local_120);
        whitespace_text =
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             Catch::clara::std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::end((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)local_120);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end0,(__normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                                           *)&whitespace_text), bVar5) {
          comp_1.position =
               (string_size_type)
               __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               ::operator*(&__end0);
          pcVar3 = pcStack_230;
          pwVar9 = (wstring *)std::__cxx11::wstring::size();
          iVar7 = std::__cxx11::wstring::compare((ulong)input,(ulong)pcVar3,pwVar9);
          if (iVar7 == 0) {
            parse::anon_class_24_3_f3e5c141::operator()
                      ((anon_class_24_3_f3e5c141 *)
                       &whitespace.
                        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            ::component((component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                         *)&tag_location_start,
                        (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                         *)comp_1.position,(string_size_type)pcStack_230);
            ppcVar15 = Catch::clara::std::
                       vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                       ::back((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                               *)local_90);
            Catch::clara::std::
            vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
            ::push_back(&(*ppcVar15)->children,(value_type *)&tag_location_start);
            lVar10 = std::__cxx11::wstring::size();
            pcStack_230 = (pointer)(&(pcStack_230->text)._M_dataplus + lVar10);
            bVar2 = true;
            component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            ::~component((component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                          *)&tag_location_start);
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ::operator++(&__end0);
        }
        if (!bVar2) {
          uVar14 = std::__cxx11::wstring::empty();
          if ((uVar14 & 1) != 0) {
            process_current_text.sections =
                 (vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                  *)pcStack_230;
          }
          std::__cxx11::wstring::operator[]((ulong)input);
          std::__cxx11::wstring::append((ulong)&current_text_position,L'\x01');
          pcStack_230 = (pointer)&(pcStack_230->text).field_0x1;
        }
      }
      pcVar3 = pcStack_230;
    } while (!bVar6);
    lVar10 = std::__cxx11::wstring::size();
    p_Stack_2f0 = &(pcVar3->text)._M_dataplus + lVar10;
    local_9c9 = false;
    if (((sections.
          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
       (local_9c9 = false, pcVar3 != (pointer)((long)&pcVar8[-1].position + 6))) {
      piVar11 = (int *)std::__cxx11::wstring::at((ulong)input);
      iVar7 = *piVar11;
      piVar11 = (int *)std::__cxx11::wstring::at((ulong)&ctx->delim_set);
      local_9c9 = iVar7 == *piVar11;
    }
    if (local_9c9 == false) {
      local_9f8 = &(ctx->delim_set).end;
    }
    else {
      local_9f8 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  local_50;
    }
    lVar10 = std::__cxx11::wstring::size();
    if (local_9c9 != false) {
      p_Stack_2f0 = p_Stack_2f0 + 1;
    }
    lVar12 = std::__cxx11::wstring::find((wstring *)input,(ulong)local_9f8);
    if (lVar12 == -1) {
      std::__cxx11::wostringstream::wostringstream(local_488);
      pwVar13 = std::operator<<((wostream *)local_488,"Unclosed tag at ");
      std::wostream::operator<<(pwVar13,(ulong)pcVar3);
      uVar4 = brace_delimiter_end_unescaped.field_2._8_8_;
      std::__cxx11::wostringstream::str();
      std::__cxx11::wstring::assign((wstring *)uVar4);
      std::__cxx11::wstring::~wstring(local_4a8);
      tag_contents.field_2._M_local_buf[3] = L'\x01';
      std::__cxx11::wostringstream::~wostringstream(local_488);
      break;
    }
    std::__cxx11::wstring::wstring
              ((wstring *)&comp.position,(wstring *)input,(ulong)p_Stack_2f0,
               lVar12 - (long)p_Stack_2f0);
    trim<std::__cxx11::wstring>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_4d0,(mustache *)&comp.position,s);
    std::__cxx11::wstring::~wstring((wstring *)&comp.position);
    component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::component((component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)local_578);
    uVar14 = std::__cxx11::wstring::empty();
    if (((uVar14 & 1) == 0) &&
       (piVar11 = (int *)std::__cxx11::wstring::operator[]((ulong)local_4d0), *piVar11 == 0x3d)) {
      bVar6 = parse_set_delimiter_tag
                        (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_4d0,&ctx->delim_set);
      if (bVar6) {
        sections.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::is_default(&ctx->delim_set);
        comp.tag.name.field_2._M_local_buf[2] = L'\b';
        this_02 = (delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *)operator_new(0x40);
        delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::delimiter_set(this_02,&ctx->delim_set);
        std::
        __shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::wstring>,(__gnu_cxx::_Lock_policy)2>
        ::reset<kainjow::mustache::delimiter_set<std::__cxx11::wstring>>
                  ((__shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::wstring>,(__gnu_cxx::_Lock_policy)2>
                    *)&comp.tag.section_text.
                       super___shared_ptr<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,this_02);
        goto LAB_0036cf04;
      }
      std::__cxx11::wostringstream::wostringstream(local_6f0);
      pwVar13 = std::operator<<((wostream *)local_6f0,"Invalid set delimiter tag at ");
      std::wostream::operator<<(pwVar13,(ulong)pcVar3);
      uVar4 = brace_delimiter_end_unescaped.field_2._8_8_;
      std::__cxx11::wostringstream::str();
      std::__cxx11::wstring::assign((wstring *)uVar4);
      std::__cxx11::wstring::~wstring(local_710);
      tag_contents.field_2._M_local_buf[3] = L'\x01';
      std::__cxx11::wostringstream::~wostringstream(local_6f0);
    }
    else {
LAB_0036cf04:
      if (comp.tag.name.field_2._M_local_buf[2] != L'\b') {
        parse_tag_contents(this,local_9c9,
                           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)local_4d0,
                           (mstch_tag<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                            *)((long)&comp.text.field_2 + 8));
      }
      comp.children.
      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar3;
      ppcVar15 = Catch::clara::std::
                 vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                 ::back((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                         *)local_90);
      Catch::clara::std::
      vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
      ::push_back(&(*ppcVar15)->children,(value_type *)local_578);
      pcStack_230 = (pointer)(lVar12 + lVar10);
      bVar6 = mstch_tag<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::is_section_begin((mstch_tag<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                                  *)((long)&comp.text.field_2 + 8));
      if (bVar6) {
        ppcVar15 = Catch::clara::std::
                   vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                   ::back((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                           *)local_90);
        local_718 = Catch::clara::std::
                    vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                    ::back(&(*ppcVar15)->children);
        Catch::clara::std::
        vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
        ::push_back((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                     *)local_90,&local_718);
        Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&current_text.field_2 + 8),
                   (value_type_conflict2 *)&stack0xfffffffffffffdd0);
      }
      else {
        bVar6 = mstch_tag<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                ::is_section_end((mstch_tag<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                                  *)((long)&comp.text.field_2 + 8));
        if (bVar6) {
          sVar16 = Catch::clara::std::
                   vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                   ::size((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                           *)local_90);
          if (sVar16 == 1) {
            std::__cxx11::wostringstream::wostringstream(local_890);
            pwVar13 = std::operator<<((wostream *)local_890,"Unopened section \"");
            pwVar13 = std::operator<<(pwVar13,(wstring *)((long)&comp.text.field_2 + 8));
            pwVar13 = std::operator<<(pwVar13,"\" at ");
            std::wostream::operator<<
                      (pwVar13,(ulong)comp.children.
                                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            uVar4 = brace_delimiter_end_unescaped.field_2._8_8_;
            std::__cxx11::wostringstream::str();
            std::__cxx11::wstring::assign((wstring *)uVar4);
            std::__cxx11::wstring::~wstring(local_8b0);
            tag_contents.field_2._M_local_buf[3] = L'\x01';
            std::__cxx11::wostringstream::~wostringstream(local_890);
            goto LAB_0036d20a;
          }
          ppcVar15 = Catch::clara::std::
                     vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                     ::back((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                             *)local_90);
          pcVar1 = *ppcVar15;
          __p = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                operator_new(0x20);
          this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    ((long)&current_text.field_2 + 8);
          Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(this_01);
          Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(this_01);
          std::__cxx11::wstring::substr((ulong)__p,(ulong)input);
          std::__shared_ptr<std::__cxx11::wstring,(__gnu_cxx::_Lock_policy)2>::
          reset<std::__cxx11::wstring>
                    ((__shared_ptr<std::__cxx11::wstring,(__gnu_cxx::_Lock_policy)2> *)
                     &(pcVar1->tag).section_text,__p);
          Catch::clara::std::
          vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
          ::pop_back((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                      *)local_90);
          Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&current_text.field_2 + 8));
        }
      }
      tag_contents.field_2._M_local_buf[3] = L'\0';
    }
LAB_0036d20a:
    component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::~component((component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  *)local_578);
    std::__cxx11::wstring::~wstring((wstring *)local_4d0);
  } while (tag_contents.field_2._M_local_buf[3] == L'\0');
LAB_0036d2f0:
  Catch::clara::std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_120);
  std::__cxx11::wstring::~wstring((wstring *)&current_text_position);
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&current_text.field_2 + 8));
  Catch::clara::std::
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  ::~vector((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
             *)local_90);
  std::__cxx11::wstring::~wstring((wstring *)local_50);
  return;
}

Assistant:

void parse(const string_type& input, context_internal<string_type>& ctx, component<string_type>& root_component, string_type& error_message) const {
        using string_size_type = typename string_type::size_type;
        using streamstring = std::basic_ostringstream<typename string_type::value_type>;

        const string_type brace_delimiter_end_unescaped(3, '}');
        const string_size_type input_size{input.size()};

        bool current_delimiter_is_brace{ctx.delim_set.is_default()};

        std::vector<component<string_type>*> sections{&root_component};
        std::vector<string_size_type> section_starts;
        string_type current_text;
        string_size_type current_text_position = string_type::npos;

        current_text.reserve(input_size);

        const auto process_current_text = [&current_text, &current_text_position, &sections]() {
            if (!current_text.empty()) {
                const component<string_type> comp{current_text, current_text_position};
                sections.back()->children.push_back(comp);
                current_text.clear();
                current_text_position = string_type::npos;
            }
        };

        const std::vector<string_type> whitespace{
            string_type(1, '\r') + string_type(1, '\n'),
            string_type(1, '\n'),
            string_type(1, '\r'),
            string_type(1, ' '),
            string_type(1, '\t'),
        };

        for (string_size_type input_position = 0; input_position != input_size;) {
            bool parse_tag = false;

            if (input.compare(input_position, ctx.delim_set.begin.size(), ctx.delim_set.begin) == 0) {
                process_current_text();

                // Tag start delimiter
                parse_tag = true;
            } else {
                bool parsed_whitespace = false;
                for (const auto& whitespace_text : whitespace) {
                    if (input.compare(input_position, whitespace_text.size(), whitespace_text) == 0) {
                        process_current_text();

                        const component<string_type> comp{whitespace_text, input_position};
                        sections.back()->children.push_back(comp);
                        input_position += whitespace_text.size();

                        parsed_whitespace = true;
                        break;
                    }
                }

                if (!parsed_whitespace) {
                    if (current_text.empty()) {
                        current_text_position = input_position;
                    }
                    current_text.append(1, input[input_position]);
                    input_position++;
                }
            }

            if (!parse_tag) {
                continue;
            }

            // Find the next tag start delimiter
            const string_size_type tag_location_start = input_position;

            // Find the next tag end delimiter
            string_size_type tag_contents_location{tag_location_start + ctx.delim_set.begin.size()};
            const bool tag_is_unescaped_var{current_delimiter_is_brace && tag_location_start != (input_size - 2) && input.at(tag_contents_location) == ctx.delim_set.begin.at(0)};
            const string_type& current_tag_delimiter_end{tag_is_unescaped_var ? brace_delimiter_end_unescaped : ctx.delim_set.end};
            const auto current_tag_delimiter_end_size = current_tag_delimiter_end.size();
            if (tag_is_unescaped_var) {
                ++tag_contents_location;
            }
            const string_size_type tag_location_end{input.find(current_tag_delimiter_end, tag_contents_location)};
            if (tag_location_end == string_type::npos) {
                streamstring ss;
                ss << "Unclosed tag at " << tag_location_start;
                error_message.assign(ss.str());
                return;
            }

            // Parse tag
            const string_type tag_contents{trim(string_type{input, tag_contents_location, tag_location_end - tag_contents_location})};
            component<string_type> comp;
            if (!tag_contents.empty() && tag_contents[0] == '=') {
                if (!parse_set_delimiter_tag(tag_contents, ctx.delim_set)) {
                    streamstring ss;
                    ss << "Invalid set delimiter tag at " << tag_location_start;
                    error_message.assign(ss.str());
                    return;
                }
                current_delimiter_is_brace = ctx.delim_set.is_default();
                comp.tag.type = tag_type::set_delimiter;
                comp.tag.delim_set.reset(new delimiter_set<string_type>(ctx.delim_set));
            }
            if (comp.tag.type != tag_type::set_delimiter) {
                parse_tag_contents(tag_is_unescaped_var, tag_contents, comp.tag);
            }
            comp.position = tag_location_start;
            sections.back()->children.push_back(comp);

            // Start next search after this tag
            input_position = tag_location_end + current_tag_delimiter_end_size;

            // Push or pop sections
            if (comp.tag.is_section_begin()) {
                sections.push_back(&sections.back()->children.back());
                section_starts.push_back(input_position);
            } else if (comp.tag.is_section_end()) {
                if (sections.size() == 1) {
                    streamstring ss;
                    ss << "Unopened section \"" << comp.tag.name << "\" at " << comp.position;
                    error_message.assign(ss.str());
                    return;
                }
                sections.back()->tag.section_text.reset(new string_type(input.substr(section_starts.back(), tag_location_start - section_starts.back())));
                sections.pop_back();
                section_starts.pop_back();
            }
        }

        process_current_text();

        // Check for sections without an ending tag
        root_component.walk_children([&error_message](component<string_type>& comp) -> typename component<string_type>::walk_control {
            if (!comp.tag.is_section_begin()) {
                return component<string_type>::walk_control::walk;
            }
            if (comp.children.empty() || !comp.children.back().tag.is_section_end() || comp.children.back().tag.name != comp.tag.name) {
                streamstring ss;
                ss << "Unclosed section \"" << comp.tag.name << "\" at " << comp.position;
                error_message.assign(ss.str());
                return component<string_type>::walk_control::stop;
            }
            comp.children.pop_back(); // remove now useless end section component
            return component<string_type>::walk_control::walk;
        });
        if (!error_message.empty()) {
            return;
        }
    }